

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.h
# Opt level: O0

target_ulong ppc_hash32_load_hpte0(PowerPCCPU_conflict3 *cpu,hwaddr pte_offset)

{
  uint32_t uVar1;
  hwaddr hVar2;
  target_ulong base;
  hwaddr pte_offset_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  hVar2 = ppc_hash32_hpt_base(cpu);
  uVar1 = ldl_phys_ppc64((cpu->env).uc,(cpu->parent_obj).as,hVar2 + pte_offset);
  return (ulong)uVar1;
}

Assistant:

static inline target_ulong ppc_hash32_load_hpte0(PowerPCCPU *cpu,
                                                 hwaddr pte_offset)
{
    target_ulong base = ppc_hash32_hpt_base(cpu);

#ifdef UNICORN_ARCH_POSTFIX
    return glue(ldl_phys, UNICORN_ARCH_POSTFIX)(cpu->env.uc, CPU(cpu)->as, base + pte_offset);
#else
    return ldl_phys(cpu->env.uc, CPU(cpu)->as, base + pte_offset);
#endif
}